

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.cpp
# Opt level: O0

Matrix3d *
eulerAnglesToRotationMatrix(Matrix3d *__return_storage_ptr__,double roll,double pitch,double yaw)

{
  QuaternionType local_128;
  undefined1 local_108 [8];
  Quaternion<double,_0> q;
  undefined1 local_c8 [8];
  AngleAxisd yawAngle;
  undefined1 local_88 [8];
  AngleAxisd pitchAngle;
  undefined1 local_48 [8];
  AngleAxisd rollAngle;
  double yaw_local;
  double pitch_local;
  double roll_local;
  Matrix3d *rotationMatrix;
  
  rollAngle.m_angle = yaw;
  yaw_local = pitch;
  pitch_local = roll;
  roll_local = (double)__return_storage_ptr__;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitX();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((AngleAxis<double> *)local_48,&pitch_local,
             (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&pitchAngle.m_angle);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((AngleAxis<double> *)local_88,&yaw_local,
             (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)&yawAngle.m_angle);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((AngleAxis<double> *)local_c8,&rollAngle.m_angle,
             (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)(q.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                 m_data.array + 3));
  Eigen::AngleAxis<double>::operator*
            (&local_128,(AngleAxis<double> *)local_c8,(AngleAxis<double> *)local_88);
  Eigen::operator*((QuaternionType *)local_108,&local_128,(AngleAxis<double> *)local_48);
  Eigen::RotationBase<Eigen::Quaternion<double,_0>,_3>::matrix
            (__return_storage_ptr__,(RotationBase<Eigen::Quaternion<double,_0>,_3> *)local_108);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d eulerAnglesToRotationMatrix(double roll, double pitch,
                                            double yaw) {
  Eigen::AngleAxisd rollAngle(roll, Eigen::Vector3d::UnitX());
  Eigen::AngleAxisd pitchAngle(pitch, Eigen::Vector3d::UnitY());
  Eigen::AngleAxisd yawAngle(yaw, Eigen::Vector3d::UnitZ());
  Eigen::Quaternion<double> q = yawAngle * pitchAngle * rollAngle;
  Eigen::Matrix3d rotationMatrix = q.matrix();
  return rotationMatrix;
}